

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool CombinationKeyTest<Blob<128>,unsigned_long>
               (hashfunc<Blob<128>_> hash,int maxlen,unsigned_long *blocks,int blockcount,
               bool testColl,bool testDist,bool drawDiagram)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *this;
  size_type sVar4;
  uint in_ECX;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_RDX;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  bool in_stack_0000004b;
  bool in_stack_0000004c;
  bool in_stack_0000004d;
  bool in_stack_0000004e;
  bool in_stack_0000004f;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_00000050;
  bool result;
  unsigned_long *key;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  pfHash in_stack_ffffffffffffff70;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *pvVar5;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_38;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  uint local_1c;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *local_18;
  uint local_c;
  hashfunc local_8 [8];
  
  local_1d = in_R8B & 1;
  local_1e = in_R9B & 1;
  local_1f = in_stack_00000008 & 1;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  printf("Keyset \'Combination\' - up to %d blocks from a set of %d - ",(ulong)in_ESI,(ulong)in_ECX)
  ;
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x1617ea);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)local_c;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  this = (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)operator_new__(uVar3);
  pvVar5 = this;
  hashfunc::operator_cast_to_function_pointer(local_8);
  CombinationKeygenRecurse<Blob<128>,unsigned_long>
            ((unsigned_long *)CONCAT44(local_1c,in_stack_ffffffffffffff90),
             (int)((ulong)local_18 >> 0x20),(int)local_18,
             (unsigned_long *)CONCAT44(local_c,in_stack_ffffffffffffff80),
             (int)((ulong)pvVar5 >> 0x20),in_stack_ffffffffffffff70,in_RDX);
  if (this != (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x0) {
    operator_delete__(this);
  }
  sVar4 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(&local_38);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar2 = TestHashList<Blob<128>>
                    (in_stack_00000050,in_stack_0000004f,in_stack_0000004e,in_stack_0000004d,
                     in_stack_0000004c,in_stack_0000004b);
  printf("\n");
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector(this);
  return bVar2;
}

Assistant:

bool CombinationKeyTest ( hashfunc<hashtype> hash, int maxlen, blocktype* blocks,
                          int blockcount, bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Combination' - up to %d blocks from a set of %d - ",maxlen,blockcount);

  //----------

  std::vector<hashtype> hashes;

  blocktype * key = new blocktype[maxlen];

  CombinationKeygenRecurse(key,0,maxlen,blocks,blockcount,hash,hashes);

  delete [] key;

  printf("%d keys\n",(int)hashes.size());

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}